

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

void opj_v4dwt_decode_step1_sse(opj_v4_t *w,OPJ_UINT32 start,OPJ_UINT32 end,__m128 c)

{
  opj_v4_t *poVar1;
  uint uVar2;
  int iVar3;
  __m128 *vw;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  
  poVar1 = w + start * 2;
  uVar2 = start + 3;
  while (uVar2 < end) {
    poVar1->f[0] = (OPJ_FLOAT32)((float)poVar1->f[0] * c[0]);
    poVar1->f[1] = (OPJ_FLOAT32)((float)poVar1->f[1] * c[1]);
    poVar1->f[2] = (OPJ_FLOAT32)((float)poVar1->f[2] * in_XMM0_Dc);
    poVar1->f[3] = (OPJ_FLOAT32)((float)poVar1->f[3] * in_XMM0_Dd);
    poVar1[2].f[0] = (OPJ_FLOAT32)((float)poVar1[2].f[0] * c[0]);
    *(float *)((long)poVar1 + 0x24) = *(float *)((long)poVar1 + 0x24) * c[1];
    *(float *)((long)poVar1 + 0x28) = *(float *)((long)poVar1 + 0x28) * in_XMM0_Dc;
    *(float *)((long)poVar1 + 0x2c) = *(float *)((long)poVar1 + 0x2c) * in_XMM0_Dd;
    poVar1[4].f[0] = (OPJ_FLOAT32)((float)poVar1[4].f[0] * c[0]);
    *(float *)((long)poVar1 + 0x44) = *(float *)((long)poVar1 + 0x44) * c[1];
    *(float *)((long)poVar1 + 0x48) = *(float *)((long)poVar1 + 0x48) * in_XMM0_Dc;
    *(float *)((long)poVar1 + 0x4c) = *(float *)((long)poVar1 + 0x4c) * in_XMM0_Dd;
    poVar1[6].f[0] = (OPJ_FLOAT32)((float)poVar1[6].f[0] * c[0]);
    *(float *)((long)poVar1 + 100) = *(float *)((long)poVar1 + 100) * c[1];
    *(float *)((long)poVar1 + 0x68) = *(float *)((long)poVar1 + 0x68) * in_XMM0_Dc;
    *(float *)((long)poVar1 + 0x6c) = *(float *)((long)poVar1 + 0x6c) * in_XMM0_Dd;
    poVar1 = poVar1 + 8;
    uVar2 = start + 7;
    start = start + 4;
  }
  iVar3 = end - start;
  if (start <= end && iVar3 != 0) {
    do {
      poVar1->f[0] = (OPJ_FLOAT32)((float)poVar1->f[0] * c[0]);
      poVar1->f[1] = (OPJ_FLOAT32)((float)poVar1->f[1] * c[1]);
      poVar1->f[2] = (OPJ_FLOAT32)((float)poVar1->f[2] * in_XMM0_Dc);
      poVar1->f[3] = (OPJ_FLOAT32)((float)poVar1->f[3] * in_XMM0_Dd);
      poVar1 = poVar1 + 2;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

static void opj_v4dwt_decode_step1_sse(opj_v4_t* w,
                                       OPJ_UINT32 start,
                                       OPJ_UINT32 end,
                                       const __m128 c)
{
    __m128* OPJ_RESTRICT vw = (__m128*) w;
    OPJ_UINT32 i;
    /* 4x unrolled loop */
    vw += 2 * start;
    for (i = start; i + 3 < end; i += 4, vw += 8) {
        __m128 xmm0 = _mm_mul_ps(vw[0], c);
        __m128 xmm2 = _mm_mul_ps(vw[2], c);
        __m128 xmm4 = _mm_mul_ps(vw[4], c);
        __m128 xmm6 = _mm_mul_ps(vw[6], c);
        vw[0] = xmm0;
        vw[2] = xmm2;
        vw[4] = xmm4;
        vw[6] = xmm6;
    }
    for (; i < end; ++i, vw += 2) {
        vw[0] = _mm_mul_ps(vw[0], c);
    }
}